

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrBIT0x2c(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  BIT(this,argument);
  return 4;
}

Assistant:

int CPU::instrBIT0x2c() {
	BIT(absolute_addr());
	return 4;
}